

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsScissorTests.cpp
# Opt level: O1

void __thiscall
deqp::gls::Functional::anon_unknown_0::FramebufferClearCase::render
          (FramebufferClearCase *this,GLuint program)

{
  uint uVar1;
  glUniform4fvFunc p_Var2;
  short sVar3;
  int iVar4;
  ClearType CVar5;
  GLint GVar6;
  undefined4 extraout_var;
  GLfloat *pGVar7;
  GLenum GVar8;
  Color clearColor;
  float clearDepth;
  int clearStencil;
  GLfloat aGStack_50 [6];
  undefined1 *local_38;
  float local_30;
  Vec3 local_2c;
  Functions *gl;
  
  iVar4 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar4);
  CVar5 = this->m_clearType;
  sVar3 = -0x7fa8;
  if (CVar5 < CLEAR_DEPTH) {
    sVar3 = (short)(0x8d7c8d8e881a8058 >> ((byte)(CVar5 << 4) & 0x3f));
  }
  if (sVar3 == -0x7272) {
    aGStack_50[0] = 1.77965e-43;
    aGStack_50[1] = -NAN;
    aGStack_50[2] = 0.0;
    aGStack_50[3] = 1.77965e-43;
  }
  else if (sVar3 == -0x7284) {
    aGStack_50[0] = 3.57331e-43;
    aGStack_50[1] = 3.57331e-43;
    aGStack_50[2] = 0.0;
    aGStack_50[3] = 3.57331e-43;
  }
  else {
    aGStack_50[0] = 1.0;
    aGStack_50[1] = 1.0;
    aGStack_50[2] = 0.5;
    aGStack_50[3] = 1.0;
  }
  aGStack_50[5] = 1.7236e-43;
  aGStack_50[4] = 0.5;
  switch(CVar5) {
  case CLEAR_COLOR_FIXED:
  case CLEAR_COLOR_FLOAT:
    pGVar7 = aGStack_50;
    GVar8 = 0x1800;
    goto LAB_0186c1a6;
  case CLEAR_COLOR_INT:
    pGVar7 = aGStack_50;
    GVar8 = 0x1800;
    goto LAB_0186c1dc;
  case CLEAR_COLOR_UINT:
    (*gl->clearBufferuiv)(0x1800,0,(GLuint *)aGStack_50);
    break;
  case CLEAR_DEPTH:
    pGVar7 = aGStack_50 + 4;
    GVar8 = 0x1801;
LAB_0186c1a6:
    (*gl->clearBufferfv)(GVar8,0,pGVar7);
    break;
  case CLEAR_STENCIL:
    pGVar7 = aGStack_50 + 5;
    GVar8 = 0x1802;
LAB_0186c1dc:
    (*gl->clearBufferiv)(GVar8,0,(GLint *)pGVar7);
    break;
  case CLEAR_DEPTH_STENCIL:
    (*gl->clearBufferfi)(0x84f9,0,0.5,0x7b);
  }
  uVar1 = this->m_clearType - CLEAR_STENCIL;
  CVar5 = this->m_clearType | CLEAR_COLOR_INT;
  if (uVar1 < 2) {
    if (CVar5 != CLEAR_DEPTH_STENCIL) goto LAB_0186c22d;
  }
  else if (CVar5 != CLEAR_DEPTH_STENCIL) {
    return;
  }
  (*gl->enable)(0xb71);
LAB_0186c22d:
  if (uVar1 < 2) {
    (*gl->enable)(0xb90);
  }
  (*gl->stencilFunc)(0x202,0x7b,0xffffffff);
  (*gl->depthFunc)(0x204);
  (*gl->disable)(0xc11);
  p_Var2 = gl->uniform4fv;
  GVar6 = (*gl->getUniformLocation)(program,"u_color");
  (*p_Var2)(GVar6,1,aGStack_50);
  local_2c.m_data[0] = -1.0;
  local_2c.m_data[1] = -1.0;
  local_2c.m_data[2] = 0.6;
  local_38 = &DAT_3f8000003f800000;
  local_30 = 0.6;
  drawQuad(gl,program,&local_2c,(Vec3 *)&local_38);
  return;
}

Assistant:

void FramebufferClearCase::render (GLuint program) const
{
	const glw::Functions&	gl					= m_renderCtx.getFunctions();

	const BufferFmtDesc		bufferFmt			= getBufferFormat(m_clearType);
	const Color				clearColor			= getMainColor(bufferFmt);

	const int				clearStencil		= 123;
	const float				clearDepth			= 0.5f;

	switch (m_clearType)
	{
		case CLEAR_COLOR_FIXED:		gl.clearBufferfv (GL_COLOR, 0, clearColor.f);						break;
		case CLEAR_COLOR_FLOAT:		gl.clearBufferfv (GL_COLOR, 0, clearColor.f);						break;
		case CLEAR_COLOR_INT:		gl.clearBufferiv (GL_COLOR, 0, clearColor.i);						break;
		case CLEAR_COLOR_UINT:		gl.clearBufferuiv(GL_COLOR, 0, clearColor.u);						break;
		case CLEAR_DEPTH:			gl.clearBufferfv (GL_DEPTH, 0, &clearDepth);						break;
		case CLEAR_STENCIL:			gl.clearBufferiv (GL_STENCIL, 0, &clearStencil);					break;
		case CLEAR_DEPTH_STENCIL:	gl.clearBufferfi (GL_DEPTH_STENCIL, 0, clearDepth, clearStencil);	break;

		default:
			DE_ASSERT(false);
	}

	const bool useDepth		= (m_clearType == CLEAR_DEPTH   || m_clearType == CLEAR_DEPTH_STENCIL);
	const bool useStencil	= (m_clearType == CLEAR_STENCIL || m_clearType == CLEAR_DEPTH_STENCIL);

	// Render something to expose changes to depth/stencil buffer
	if (useDepth || useStencil)
	{
		if (useDepth)
			gl.enable(GL_DEPTH_TEST);

		if (useStencil)
			gl.enable(GL_STENCIL_TEST);

		gl.stencilFunc(GL_EQUAL, clearStencil, ~0u);
		gl.depthFunc(GL_GREATER);
		gl.disable(GL_SCISSOR_TEST);

		gl.uniform4fv(gl.getUniformLocation(program, "u_color"), 1, clearColor.f);
		drawQuad(gl, program, tcu::Vec3(-1.0f, -1.0f, 0.6f), tcu::Vec3(1.0f, 1.0f, 0.6f));
	}
}